

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

TimeLevel __thiscall amrex::AmrLevel::which_time(AmrLevel *this,int indx,Real time)

{
  pointer pSVar1;
  TimeCenter TVar2;
  TimeLevel TVar3;
  Real RVar4;
  double dVar5;
  double dVar6;
  Real RVar7;
  double dVar8;
  
  pSVar1 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar2 = StateDescriptor::timeType(pSVar1[indx].desc);
  if (TVar2 == Point) {
    RVar4 = pSVar1[indx].old_time.stop;
  }
  else {
    RVar4 = (pSVar1[indx].old_time.start + pSVar1[indx].old_time.stop) * 0.5;
  }
  pSVar1 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar2 = StateDescriptor::timeType(pSVar1[indx].desc);
  if (TVar2 == Point) {
    RVar7 = pSVar1[indx].new_time.stop;
  }
  else {
    RVar7 = (pSVar1[indx].new_time.start + pSVar1[indx].new_time.stop) * 0.5;
  }
  dVar5 = RVar7 - RVar4;
  dVar6 = dVar5 * 0.001;
  if (((((time < RVar4 - dVar6) || (TVar3 = AmrOldTime, RVar4 + dVar6 < time)) &&
       ((time < RVar7 - dVar6 || (TVar3 = AmrNewTime, RVar7 + dVar6 < time)))) &&
      ((dVar8 = (RVar7 + RVar4) * 0.5, time < dVar8 - dVar6 ||
       (TVar3 = AmrHalfTime, dVar8 + dVar6 < time)))) &&
     ((dVar8 = dVar5 * 0.25 + RVar4, time < dVar8 - dVar6 ||
      (TVar3 = Amr1QtrTime, dVar8 + dVar6 < time)))) {
    dVar5 = dVar5 * 0.75 + RVar4;
    TVar3 = (time < dVar5 - dVar6 || dVar5 + dVar6 < time) + Amr3QtrTime;
  }
  return TVar3;
}

Assistant:

AmrLevel::TimeLevel
AmrLevel::which_time (int  indx, Real time) const noexcept
{
    const Real oldtime = state[indx].prevTime();
    const Real newtime = state[indx].curTime();
    const Real haftime = .5_rt * (oldtime + newtime);
    const Real qtime = oldtime + 0.25_rt*(newtime-oldtime);
    const Real tqtime = oldtime + 0.75_rt*(newtime-oldtime);
    const Real epsilon = 0.001_rt * (newtime - oldtime);

    BL_ASSERT(time >= oldtime-epsilon && time <= newtime+epsilon);

    if (time >= oldtime-epsilon && time <= oldtime+epsilon)
    {
        return AmrOldTime;
    }
    else if (time >= newtime-epsilon && time <= newtime+epsilon)
    {
        return AmrNewTime;
    }
    else if (time >= haftime-epsilon && time <= haftime+epsilon)
    {
        return AmrHalfTime;
    }
    else if (time >= qtime-epsilon && time <= qtime+epsilon)
    {
        return Amr1QtrTime;
    }
    else if (time >= tqtime-epsilon && time <= tqtime+epsilon)
    {
        return Amr3QtrTime;
    }
    return AmrOtherTime;
}